

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void codestring(LexState *ls,expdesc *e,TString *s)

{
  int iVar1;
  
  iVar1 = luaK_stringK(ls->fs,s);
  e->t = -1;
  e->f = -1;
  e->k = VK;
  (e->u).info = iVar1;
  e->ravi_type_map = 0x100;
  e->usertype = (TString *)0x0;
  e->pc = -1;
  (e->u).ind.usertype = (TString *)0x0;
  return;
}

Assistant:

static void codestring (LexState *ls, expdesc *e, TString *s) {
  init_exp(e, VK, luaK_stringK(ls->fs, s), RAVI_TM_STRING, NULL);
}